

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O2

void __thiscall spatial_region::update_energy_deleted(spatial_region *this,particle *a)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = a->cmr;
  auVar8._0_8_ = (this->dx * 8.2e-14 * this->dy * this->dz * 11148500000000.0 * lambda) /
                 248.05021344239853;
  auVar8._8_8_ = 0;
  if ((dVar1 == -1.0) && (!NAN(dVar1))) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->energy_e_deleted;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (a->g + -1.0) * a->q;
    auVar8 = vfnmadd213sd_fma(auVar8,auVar9,auVar3);
    this->energy_e_deleted = auVar8._0_8_;
    return;
  }
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->energy_p_deleted;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (a->g + -1.0) * a->q;
    auVar8 = vfmadd213sd_fma(auVar8,auVar10,auVar4);
    this->energy_p_deleted = auVar8._0_8_;
    return;
  }
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this->energy_ph_deleted;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = a->q * a->g;
    auVar8 = vfmadd213sd_fma(auVar8,auVar11,auVar5);
    this->energy_ph_deleted = auVar8._0_8_;
    return;
  }
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    if ((uint)(~(this->n_ion_populations >> 0x1f) & this->n_ion_populations) == uVar7) {
      return;
    }
    dVar2 = this->icmr[uVar7];
    uVar6 = uVar7 + 1;
  } while ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2)));
  this->ienergy_deleted[uVar7] =
       (auVar8._0_8_ * (a->g + -1.0) * a->q) / dVar2 + this->ienergy_deleted[uVar7];
  return;
}

Assistant:

void spatial_region::update_energy_deleted(particle* a)
{
    double norm = 8.2e-14*dx*dy*dz*1.11485e13*lambda/(8*PI*PI*PI); // energy in Joules
    if (a->cmr == -1)
    {
        spatial_region::energy_e_deleted -= a->q * (a->g - 1) * norm; // energy should be positive in file
    }
    else if (a->cmr == 1)
    {
        spatial_region::energy_p_deleted += a->q * (a->g - 1) * norm;
    }
    else if (a->cmr == 0)
    {
        spatial_region::energy_ph_deleted += a->q * a->g * norm;
    }
    else
    {
        for (int j=0; j<n_ion_populations; ++j)
        {
            if (a->cmr == icmr[j])
            {
                spatial_region::ienergy_deleted[j] += a->q * (a->g - 1) * norm / icmr[j];
                break;
            }
        }
    }
}